

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_decoder.c
# Opt level: O2

lzma_ret lzma_lz_decoder_init
                   (lzma_next_coder *next,lzma_allocator *allocator,lzma_filter_info *filters,
                   _func_lzma_ret_lzma_lz_decoder_ptr_lzma_allocator_ptr_void_ptr_lzma_lz_options_ptr
                   *lz_init)

{
  long *plVar1;
  lzma_ret lVar2;
  undefined8 *puVar3;
  size_t sVar4;
  void *pvVar5;
  lzma_lz_options lz_options;
  
  puVar3 = (undefined8 *)next->coder;
  if (puVar3 == (undefined8 *)0x0) {
    puVar3 = (undefined8 *)lzma_alloc(0x10b8,allocator);
    if (puVar3 == (undefined8 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->coder = puVar3;
    next->code = lz_decode;
    next->end = lz_decoder_end;
    *puVar3 = 0;
    puVar3[4] = 0;
    puVar3[6] = 0;
    puVar3[7] = 0;
    puVar3[8] = 0;
    puVar3[9] = 0;
    puVar3[10] = 0;
    puVar3[0xb] = 0;
    puVar3[0xc] = 0xffffffffffffffff;
    puVar3[0xd] = 0;
    puVar3[0xe] = 0;
    puVar3[0xf] = 0;
    puVar3[0x10] = 0;
    puVar3[0x11] = 0;
    puVar3[0x12] = 0;
    puVar3[0x13] = 0;
  }
  lVar2 = (*lz_init)((lzma_lz_decoder *)(puVar3 + 6),allocator,filters->options,&lz_options);
  if (lVar2 == LZMA_OK) {
    lVar2 = LZMA_MEM_ERROR;
    sVar4 = 0x1000;
    if ((lz_options.dict_size < 0x1000) ||
       (sVar4 = lz_options.dict_size, lz_options.dict_size < 0xfffffffffffffff1)) {
      lz_options.dict_size = sVar4 + 0xf & 0xfffffffffffffff0;
      if (puVar3[4] != lz_options.dict_size) {
        lzma_free((void *)*puVar3,allocator);
        pvVar5 = lzma_alloc(lz_options.dict_size,allocator);
        *puVar3 = pvVar5;
        if (pvVar5 == (void *)0x0) {
          return LZMA_MEM_ERROR;
        }
        puVar3[4] = lz_options.dict_size;
      }
      plVar1 = (long *)next->coder;
      plVar1[1] = 0;
      plVar1[2] = 0;
      *(undefined1 *)(*plVar1 + -1 + plVar1[4]) = 0;
      *(undefined1 *)(plVar1 + 5) = 0;
      if (lz_options.preset_dict_size != 0 && lz_options.preset_dict != (uint8_t *)0x0) {
        sVar4 = lz_options.dict_size;
        if (lz_options.preset_dict_size < lz_options.dict_size) {
          sVar4 = lz_options.preset_dict_size;
        }
        memcpy((void *)*puVar3,lz_options.preset_dict + (lz_options.preset_dict_size - sVar4),sVar4)
        ;
        puVar3[1] = sVar4;
        puVar3[2] = sVar4;
      }
      *(undefined2 *)(puVar3 + 0x14) = 0;
      puVar3[0x15] = 0;
      puVar3[0x16] = 0;
      lVar2 = lzma_next_filter_init((lzma_next_coder *)(puVar3 + 0xb),allocator,filters + 1);
    }
  }
  return lVar2;
}

Assistant:

extern lzma_ret
lzma_lz_decoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_filter_info *filters,
		lzma_ret (*lz_init)(lzma_lz_decoder *lz,
			const lzma_allocator *allocator, const void *options,
			lzma_lz_options *lz_options))
{
	// Allocate the base structure if it isn't already allocated.
	lzma_coder *coder = next->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &lz_decode;
		next->end = &lz_decoder_end;

		coder->dict.buf = NULL;
		coder->dict.size = 0;
		coder->lz = LZMA_LZ_DECODER_INIT;
		coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Allocate and initialize the LZ-based decoder. It will also give
	// us the dictionary size.
	lzma_lz_options lz_options;
	return_if_error(lz_init(&coder->lz, allocator,
			filters[0].options, &lz_options));

	// If the dictionary size is very small, increase it to 4096 bytes.
	// This is to prevent constant wrapping of the dictionary, which
	// would slow things down. The downside is that since we don't check
	// separately for the real dictionary size, we may happily accept
	// corrupt files.
	if (lz_options.dict_size < 4096)
		lz_options.dict_size = 4096;

	// Make dictionary size a multiple of 16. Some LZ-based decoders like
	// LZMA use the lowest bits lzma_dict.pos to know the alignment of the
	// data. Aligned buffer is also good when memcpying from the
	// dictionary to the output buffer, since applications are
	// recommended to give aligned buffers to liblzma.
	//
	// Avoid integer overflow.
	if (lz_options.dict_size > SIZE_MAX - 15)
		return LZMA_MEM_ERROR;

	lz_options.dict_size = (lz_options.dict_size + 15) & ~((size_t)(15));

	// Allocate and initialize the dictionary.
	if (coder->dict.size != lz_options.dict_size) {
		lzma_free(coder->dict.buf, allocator);
		coder->dict.buf
				= lzma_alloc(lz_options.dict_size, allocator);
		if (coder->dict.buf == NULL)
			return LZMA_MEM_ERROR;

		coder->dict.size = lz_options.dict_size;
	}

	lz_decoder_reset(next->coder);

	// Use the preset dictionary if it was given to us.
	if (lz_options.preset_dict != NULL
			&& lz_options.preset_dict_size > 0) {
		// If the preset dictionary is bigger than the actual
		// dictionary, copy only the tail.
		const size_t copy_size = my_min(lz_options.preset_dict_size,
				lz_options.dict_size);
		const size_t offset = lz_options.preset_dict_size - copy_size;
		memcpy(coder->dict.buf, lz_options.preset_dict + offset,
				copy_size);
		coder->dict.pos = copy_size;
		coder->dict.full = copy_size;
	}

	// Miscellaneous initializations
	coder->next_finished = false;
	coder->this_finished = false;
	coder->temp.pos = 0;
	coder->temp.size = 0;

	// Initialize the next filter in the chain, if any.
	return lzma_next_filter_init(&coder->next, allocator, filters + 1);
}